

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

HTS_Boolean HTS_get_token_from_string(char *string,size_t *index,char *buff)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = *index;
  if (string[sVar2] != '\0') {
    *index = sVar2 + 1;
    bVar1 = string[sVar2];
    if (bVar1 != 0) {
      sVar2 = sVar2 + 2;
      while ((bVar1 < 0x21 && ((0x100000600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))) {
        *index = sVar2;
        bVar1 = string[sVar2 - 1];
        sVar2 = sVar2 + 1;
      }
      while ((0x20 < bVar1 || ((0x100000601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
        *buff = bVar1;
        sVar2 = *index;
        *index = sVar2 + 1;
        bVar1 = string[sVar2];
        buff = (char *)((byte *)buff + 1);
      }
      *buff = 0;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

HTS_Boolean HTS_get_token_from_string(const char *string, size_t * index, char *buff)
{
   char c;
   size_t i;

   c = string[(*index)];
   if (c == '\0')
      return FALSE;
   c = string[(*index)++];
   if (c == '\0')
      return FALSE;
   while (c == ' ' || c == '\n' || c == '\t') {
      if (c == '\0')
         return FALSE;
      c = string[(*index)++];
   }
   for (i = 0; c != ' ' && c != '\n' && c != '\t' && c != '\0'; i++) {
      buff[i] = c;
      c = string[(*index)++];
   }

   buff[i] = '\0';
   return TRUE;
}